

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::GetAttributesWithPropertyIndex
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          BigPropertyIndex index,PropertyAttributes *attributes)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  int iVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  PropertyAttributes *attributes_local;
  BigPropertyIndex index_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  uVar3 = GetPathLength(this);
  if (index < (int)(uint)uVar3) {
    pSVar5 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    iVar4 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[9])
                      (this,pSVar5,(ulong)(uint)index);
    if (iVar4 != propertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x75c,
                                  "(this->GetPropertyId(instance->GetScriptContext(), index) == propertyId)"
                                  ,
                                  "this->GetPropertyId(instance->GetScriptContext(), index) == propertyId"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    *attributes = '\a';
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerBase::GetAttributesWithPropertyIndex(DynamicObject * instance, PropertyId propertyId, BigPropertyIndex index, PropertyAttributes * attributes)
    {
        if (index < this->GetPathLength())
        {
            Assert(this->GetPropertyId(instance->GetScriptContext(), index) == propertyId);
            *attributes = PropertyDynamicTypeDefaults;
            return true;
        }
        return false;
    }